

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.hpp
# Opt level: O0

void __thiscall nite::Console::Result::Result(Result *this,string *msg,Color *color)

{
  Color *color_local;
  string *msg_local;
  Result *this_local;
  
  std::__cxx11::string::string((string *)this);
  Color::Color(&this->color);
  std::__cxx11::string::operator=((string *)this,(string *)msg);
  Color::set(&this->color,color);
  return;
}

Assistant:

Result(const String &msg, const nite::Color &color){
                    this->msg = msg;
                    this->color.set(color);
                }